

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Synth_::adjust_impulse(Blip_Synth_ *this)

{
  int iVar1;
  short *psVar2;
  short sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  lVar6 = (long)this->width * 0x20;
  iVar1 = this->kernel_unit;
  psVar2 = this->impulses;
  lVar8 = 0x80;
  lVar5 = 0;
  uVar7 = 0x40;
  while (0x1f < uVar7) {
    lVar4 = (long)iVar1;
    for (lVar9 = 0; lVar9 + 1 <= lVar6; lVar9 = lVar9 + 0x40) {
      lVar4 = lVar4 - ((long)*(short *)((long)this->impulses + lVar9 * 2 + lVar5) +
                      (long)*(short *)((long)this->impulses + lVar9 * 2 + lVar8));
    }
    sVar3 = (short)lVar4;
    if (uVar7 - 1 == (ulong)(0x3f - (int)uVar7)) {
      sVar3 = (short)(lVar4 / 2);
    }
    psVar2[(long)(int)lVar6 + (uVar7 - 0x40)] = psVar2[(long)(int)lVar6 + (uVar7 - 0x40)] + sVar3;
    lVar5 = lVar5 + 2;
    lVar8 = lVar8 + -2;
    uVar7 = uVar7 - 1;
  }
  return;
}

Assistant:

void Blip_Buffer::remove_samples( long count )
{
	if ( count )
	{
		remove_silence( count );
		
		// copy remaining samples to beginning and clear old samples
		long remain = samples_avail() + blip_buffer_extra_;
		memmove( buffer_, buffer_ + count, remain * sizeof *buffer_ );
		memset( buffer_ + remain, 0, count * sizeof *buffer_ );
	}
}